

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_clsid.cxx
# Opt level: O0

void __thiscall xray_re::xr_clsid::get(xr_clsid *this,char *s)

{
  int c;
  char *end;
  char *p;
  char *s_local;
  xr_clsid *this_local;
  
  p = s;
  for (end = (char *)this; ((xr_clsid *)end != this + 1 && (*end != ' ')); end = end + 1) {
    *p = *end;
    p = p + 1;
  }
  *p = '\0';
  return;
}

Assistant:

void xr_clsid::get(char* s) const
{
	for (const char *p = bytes, *end = p + 8; p != end; ++p) {
		int c = *p;
		if (c == ' ')
			break;
		*s++ = c;
	}
	*s = '\0';
}